

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::buildModel(FastText *this)

{
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  createLoss((FastText *)&stack0xffffffffffffffd8,(shared_ptr<fasttext::Matrix> *)this);
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
            ((shared_ptr<fasttext::Matrix> *)&local_38,&this->input_,
             (shared_ptr<fasttext::Loss> *)&this->output_,(bool *)&stack0xffffffffffffffd8);
  std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void FastText::buildModel() {
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}